

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_down_edges(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BATType BVar6;
  bool bVar7;
  IndexType IVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  BoxArray *bxs;
  undefined4 in_ECX;
  MultiFab *in_RDX;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  MultiFab ctmp;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *finearr;
  Array4<double> *crsearr;
  Box *bx;
  MFIter mfi;
  int ncomp;
  IndexType tmptype;
  int dir;
  IndexType type;
  int kref;
  Real c_2;
  Real facInv_2;
  int jref;
  Real c_1;
  Real facInv_1;
  int iref;
  Real c;
  Real facInv;
  int kk;
  int jj;
  int ii;
  int facz;
  int facy;
  int facx;
  FabArrayBase *in_stack_fffffffffffff978;
  BoxArray *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  FabArrayBase *in_stack_fffffffffffff990;
  BoxArray *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  FabArrayBase *in_stack_fffffffffffff9a8;
  undefined1 *puVar12;
  MFIter *in_stack_fffffffffffff9b0;
  DistributionMapping *dm;
  int iVar13;
  int in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffff9d4;
  undefined8 in_stack_fffffffffffff9d8;
  int *piVar14;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9e0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **ppVVar15;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff9e8;
  MFIter *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffffa00;
  Periodicity *in_stack_fffffffffffffa08;
  CpOp op;
  DistributionMapping local_5b8 [30];
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  undefined8 local_3c0;
  int local_3b8;
  undefined8 local_3ac;
  int local_3a4;
  undefined8 local_3a0;
  int local_398;
  undefined8 local_390;
  int local_388;
  MFIter local_380;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_2f8;
  int local_2ec [7];
  int *local_2d0;
  MFIter local_2c8;
  int local_264;
  uint local_260;
  int ngcrse_00;
  undefined4 uVar16;
  int local_15c;
  double local_158;
  int local_144;
  double local_140;
  int local_12c;
  double local_128;
  
  IVar8 = FabArrayBase::ixType(in_stack_fffffffffffff978);
  ngcrse_00 = 0;
  while ((ngcrse_00 < 3 && ((IVar8.itype & 1 << ((byte)ngcrse_00 & 0x1f)) != 0))) {
    ngcrse_00 = ngcrse_00 + 1;
  }
  local_260 = 1 << ((byte)ngcrse_00 & 0x1f) | IVar8.itype;
  if ((2 < ngcrse_00) || (local_260 != 7)) {
    Abort_host((char *)in_stack_fffffffffffff990);
  }
  local_264 = FabArrayBase::nComp(in_RSI);
  bVar7 = isMFIterSafe(in_stack_fffffffffffff990,
                       (FabArrayBase *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)
                      );
  if (bVar7) {
    TilingIfNotGPU();
    MFIter::MFIter(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                   SUB41((uint)in_stack_fffffffffffff9a4 >> 0x18,0));
    while (bVar7 = MFIter::isValid(&local_2c8), bVar7) {
      piVar14 = local_2ec;
      MFIter::growntilebox(in_stack_fffffffffffff9f0,(int)((ulong)&local_2c8 >> 0x20));
      ppVVar15 = &local_380.tile_array;
      local_2d0 = piVar14;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                 (MFIter *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff9f0 = &local_380;
      local_2f8 = ppVVar15;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                 (MFIter *)in_stack_fffffffffffff980);
      iVar13 = *local_2d0;
      iVar1 = local_2d0[1];
      local_3a0 = *(undefined8 *)local_2d0;
      local_398 = local_2d0[2];
      iVar2 = local_2d0[3];
      iVar3 = local_2d0[4];
      local_3c0 = *(undefined8 *)(local_2d0 + 3);
      local_3b8 = local_2d0[5];
      for (local_3c4 = 0; iVar4 = local_398, local_3c4 < local_264; local_3c4 = local_3c4 + 1) {
        while (local_3c8 = iVar4, iVar4 = iVar1, local_3c8 <= local_3b8) {
          while (local_3cc = iVar4, iVar4 = iVar13, local_3cc <= iVar3) {
            while (local_3d0 = iVar4, local_3d0 <= iVar2) {
              iVar4 = *(int *)&(in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase;
              iVar5 = *(int *)((long)&(in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                      _vptr_FabArrayBase + 4);
              BVar6 = (in_RDX->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                      m_bat_type;
              iVar9 = local_3d0 * iVar4;
              iVar10 = local_3cc * iVar5;
              iVar11 = local_3c8 * BVar6;
              if (ngcrse_00 == 0) {
                local_128 = 0.0;
                for (local_12c = 0; local_12c < iVar4; local_12c = local_12c + 1) {
                  local_128 = (double)(&((in_stack_fffffffffffff9f0->m_fa)._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl)->_vptr_FabArrayBase)
                                      [(long)((iVar9 + local_12c) -
                                             in_stack_fffffffffffff9f0->currentIndex) +
                                       (long)(iVar10 - in_stack_fffffffffffff9f0->beginIndex) *
                                       (long)in_stack_fffffffffffff9f0->fabArray +
                                       (long)(iVar11 - in_stack_fffffffffffff9f0->endIndex) *
                                       *(long *)(in_stack_fffffffffffff9f0->tile_size).vect +
                                       (long)local_3c4 *
                                       *(long *)((in_stack_fffffffffffff9f0->tile_size).vect + 2)] +
                              local_128;
                }
                (&((*local_2f8)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start)
                [(long)(local_3d0 - (int)local_2f8[4]) +
                 (long)(local_3cc - *(int *)((long)local_2f8 + 0x24)) * (long)local_2f8[1] +
                 (long)(local_3c8 - (int)local_2f8[5]) * (long)local_2f8[2] +
                 (long)local_3c4 * (long)local_2f8[3]] =
                     (pointer)(local_128 * (1.0 / (double)iVar4));
              }
              else if (ngcrse_00 == 1) {
                local_140 = 0.0;
                for (local_144 = 0; local_144 < iVar5; local_144 = local_144 + 1) {
                  local_140 = (double)(&((in_stack_fffffffffffff9f0->m_fa)._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl)->_vptr_FabArrayBase)
                                      [(long)(iVar9 - in_stack_fffffffffffff9f0->currentIndex) +
                                       (long)((iVar10 + local_144) -
                                             in_stack_fffffffffffff9f0->beginIndex) *
                                       (long)in_stack_fffffffffffff9f0->fabArray +
                                       (long)(iVar11 - in_stack_fffffffffffff9f0->endIndex) *
                                       *(long *)(in_stack_fffffffffffff9f0->tile_size).vect +
                                       (long)local_3c4 *
                                       *(long *)((in_stack_fffffffffffff9f0->tile_size).vect + 2)] +
                              local_140;
                }
                (&((*local_2f8)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start)
                [(long)(local_3d0 - (int)local_2f8[4]) +
                 (long)(local_3cc - *(int *)((long)local_2f8 + 0x24)) * (long)local_2f8[1] +
                 (long)(local_3c8 - (int)local_2f8[5]) * (long)local_2f8[2] +
                 (long)local_3c4 * (long)local_2f8[3]] =
                     (pointer)(local_140 * (1.0 / (double)iVar5));
              }
              else if (ngcrse_00 == 2) {
                local_158 = 0.0;
                for (local_15c = 0; local_15c < (int)BVar6; local_15c = local_15c + 1) {
                  local_158 = (double)(&((in_stack_fffffffffffff9f0->m_fa)._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                        _M_head_impl)->_vptr_FabArrayBase)
                                      [(long)(iVar9 - in_stack_fffffffffffff9f0->currentIndex) +
                                       (long)(iVar10 - in_stack_fffffffffffff9f0->beginIndex) *
                                       (long)in_stack_fffffffffffff9f0->fabArray +
                                       (long)((iVar11 + local_15c) -
                                             in_stack_fffffffffffff9f0->endIndex) *
                                       *(long *)(in_stack_fffffffffffff9f0->tile_size).vect +
                                       (long)local_3c4 *
                                       *(long *)((in_stack_fffffffffffff9f0->tile_size).vect + 2)] +
                              local_158;
                }
                (&((*local_2f8)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start)
                [(long)(local_3d0 - (int)local_2f8[4]) +
                 (long)(local_3cc - *(int *)((long)local_2f8 + 0x24)) * (long)local_2f8[1] +
                 (long)(local_3c8 - (int)local_2f8[5]) * (long)local_2f8[2] +
                 (long)local_3c4 * (long)local_2f8[3]] =
                     (pointer)(local_158 * (1.0 / (double)(int)BVar6));
              }
              iVar4 = local_3d0 + 1;
            }
            iVar4 = local_3cc + 1;
          }
          iVar4 = local_3c8 + 1;
        }
      }
      local_3ac = local_3c0;
      local_3a4 = local_3b8;
      local_390 = local_3a0;
      local_388 = local_398;
      local_380.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0;
      MFIter::operator++(&local_2c8);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffff980);
  }
  else {
    FabArrayBase::boxArray(in_RDI);
    dm = local_5b8;
    coarsen(in_stack_fffffffffffff998,(IntVect *)in_stack_fffffffffffff990);
    bxs = (BoxArray *)FabArrayBase::DistributionMap(in_RDI);
    iVar13 = local_264;
    uVar16 = in_ECX;
    MFInfo::MFInfo((MFInfo *)0x12dbfe2);
    op = COPY;
    puVar12 = &stack0xfffffffffffffa10;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff980);
    MultiFab::MultiFab((MultiFab *)CONCAT44(in_ECX,iVar13),bxs,dm,(int)((ulong)puVar12 >> 0x20),
                       (int)puVar12,
                       (MFInfo *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       (FabFactory<amrex::FArrayBox> *)
                       CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x12dc03f);
    MFInfo::~MFInfo((MFInfo *)0x12dc04c);
    BoxArray::~BoxArray(in_stack_fffffffffffff980);
    average_down_edges((MultiFab *)in_RSI,in_RDX,(IntVect *)CONCAT44(uVar16,IVar8.itype),ngcrse_00);
    Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),(int)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0,in_stack_fffffffffffffa00,
               in_stack_fffffffffffffa08,op);
    MultiFab::~MultiFab((MultiFab *)0x12dc0ea);
  }
  return;
}

Assistant:

void average_down_edges (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.cellCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.set(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.nodeCentered()) {
            amrex::Abort("average_down_edges: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_edges(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_edges(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_edges(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }